

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabwidget.cpp
# Opt level: O2

int __thiscall QTabWidget::heightForWidth(QTabWidget *this,int width)

{
  TabPosition TVar1;
  long lVar2;
  QTabWidgetPrivate *this_00;
  QWidget *pQVar3;
  bool bVar4;
  QStyle *pQVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  QSize QVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  QTabWidget *that;
  Representation RVar13;
  long in_FS_OFFSET;
  QSize local_e8;
  QSize local_e0;
  QSize local_d8;
  QSize local_d0;
  undefined8 local_c8;
  QStyleOptionTabWidgetFrame opt;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTabWidgetPrivate **)&(this->super_QWidget).field_0x8;
  memset(&opt,0xaa,0x88);
  QStyleOptionTabWidgetFrame::QStyleOptionTabWidgetFrame(&opt);
  (**(code **)(*(long *)&this->super_QWidget + 0x1b0))(this,&opt);
  opt.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorage<QStyle::StateFlag>)0x0;
  local_c8 = 0;
  pQVar5 = QWidget::style(&this->super_QWidget);
  uVar6 = (**(code **)(*(long *)pQVar5 + 0xe8))(pQVar5,0x11,&opt,&local_c8,this);
  local_d0.wd.m_i = 0;
  local_d0.ht.m_i = 0;
  local_d8.wd.m_i = 0;
  local_d8.ht.m_i = 0;
  pQVar3 = this_00->leftCornerWidget;
  RVar13.m_i = 0;
  if ((pQVar3 != (QWidget *)0x0) && ((pQVar3->data->widget_attributes & 0x8000) != 0)) {
    local_d0 = (QSize)(**(code **)(*(long *)pQVar3 + 0x70))();
  }
  QVar9 = local_d0;
  pQVar3 = this_00->rightCornerWidget;
  if ((pQVar3 != (QWidget *)0x0) && ((pQVar3->data->widget_attributes & 0x8000) != 0)) {
    local_d8 = (QSize)(**(code **)(*(long *)pQVar3 + 0x70))();
    RVar13 = local_d8.wd.m_i;
  }
  if (this_00->dirty == false) {
    setUpLayout(this,true);
  }
  local_e0.wd.m_i = -1;
  local_e0.ht.m_i = -1;
  bVar4 = QTabWidgetPrivate::isAutoHidden(this_00);
  if (bVar4) {
    uVar8 = 0xffffffffffffffff;
  }
  else {
    uVar7 = (**(code **)(*(long *)&this_00->tabs->super_QWidget + 0x70))();
    bVar4 = usesScrollButtons(this);
    if (bVar4) {
      uVar10 = 200;
      iVar12 = 200;
      uVar8 = 200;
    }
    else {
      QGuiApplication::primaryScreen();
      uVar8 = QScreen::virtualSize();
      uVar10 = (uint)(uVar8 >> 0x20);
      iVar12 = (int)uVar8;
    }
    if ((int)uVar7 < iVar12) {
      uVar8 = uVar7;
    }
    uVar8 = uVar8 & 0xffffffff;
    uVar11 = (ulong)uVar10;
    if ((int)(uVar7 >> 0x20) < (int)uVar10) {
      uVar11 = uVar7 >> 0x20;
    }
    local_e0 = (QSize)((uVar11 << 0x20) + uVar8);
  }
  TVar1 = this_00->pos;
  iVar12 = width - (int)uVar6;
  if (South < TVar1) {
    if (RVar13.m_i < QVar9.wd.m_i.m_i) {
      RVar13.m_i = QVar9.wd.m_i.m_i;
    }
    if (RVar13.m_i < (int)uVar8) {
      RVar13.m_i = (int)uVar8;
    }
    iVar12 = iVar12 - RVar13.m_i;
  }
  local_e8.ht.m_i =
       (**(code **)(*(long *)&(this_00->stack->super_QFrame).super_QWidget + 0x80))
                 (this_00->stack,iVar12);
  local_e8.wd.m_i = iVar12;
  QVar9 = basicSize(TVar1 < West,&local_d0,&local_d8,&local_e8,&local_e0);
  QStyleOption::~QStyleOption(&opt.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return QVar9.ht.m_i.m_i + (int)((ulong)uVar6 >> 0x20);
  }
  __stack_chk_fail();
}

Assistant:

int QTabWidget::heightForWidth(int width) const
{
    Q_D(const QTabWidget);
    QStyleOptionTabWidgetFrame opt;
    initStyleOption(&opt);
    opt.state = QStyle::State_None;

    QSize zero(0,0);
    const QSize padding = style()->sizeFromContents(QStyle::CT_TabWidget, &opt, zero, this);

    QSize lc(0, 0), rc(0, 0);
    if (d->leftCornerWidget && d->leftCornerWidget->isVisible())
        lc = d->leftCornerWidget->sizeHint();
    if (d->rightCornerWidget && d->rightCornerWidget->isVisible())
        rc = d->rightCornerWidget->sizeHint();
    if (!d->dirty) {
        QTabWidget *that = const_cast<QTabWidget*>(this);
        that->setUpLayout(true);
    }
    QSize t;
    if (!d->isAutoHidden()) {
        t = d->tabs->sizeHint();
        if (usesScrollButtons())
            t = t.boundedTo(QSize(200,200));
        else
            t = t.boundedTo(QGuiApplication::primaryScreen()->virtualSize());
    }

    const bool tabIsHorizontal = (d->pos == North || d->pos == South);
    const int contentsWidth = width - padding.width();
    int stackWidth = contentsWidth;
    if (!tabIsHorizontal)
        stackWidth -= qMax(t.width(), qMax(lc.width(), rc.width()));

    int stackHeight = d->stack->heightForWidth(stackWidth);
    QSize s(stackWidth, stackHeight);

    QSize contentSize = basicSize(tabIsHorizontal, lc, rc, s, t);
    return (contentSize + padding).height();
}